

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pruned_grid.hpp
# Opt level: O0

spherical_grid_ptr __thiscall
IntegratorXX::detail::
make_pruned_grid<IntegratorXX::RadialTransformQuadrature<IntegratorXX::GaussChebyshev2<double,double>,IntegratorXX::TreutlerAhlrichsRadialTraits>>
          (detail *this,
          RadialTransformQuadrature<IntegratorXX::GaussChebyshev2<double,_double>,_IntegratorXX::TreutlerAhlrichsRadialTraits>
          *rq,vector<IntegratorXX::PruningRegion,_std::allocator<IntegratorXX::PruningRegion>_>
              *pruning_regions)

{
  AngularQuad AVar1;
  bool bVar2;
  size_type sVar3;
  runtime_error *prVar4;
  const_reference pvVar5;
  reference pPVar6;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  spherical_grid_ptr sVar8;
  PruningRegion r;
  const_iterator __end2;
  const_iterator __begin2;
  vector<IntegratorXX::PruningRegion,_std::allocator<IntegratorXX::PruningRegion>_> *__range2;
  AngularQuad angular_quad;
  vector<IntegratorXX::PruningRegion,_std::allocator<IntegratorXX::PruningRegion>_>
  *pruning_regions_local;
  RadialTransformQuadrature<IntegratorXX::GaussChebyshev2<double,_double>,_IntegratorXX::TreutlerAhlrichsRadialTraits>
  *rq_local;
  
  sVar3 = std::vector<IntegratorXX::PruningRegion,_std::allocator<IntegratorXX::PruningRegion>_>::
          size(pruning_regions);
  if (sVar3 == 0) {
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar4,"No Pruning Regions");
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pvVar5 = std::vector<IntegratorXX::PruningRegion,_std::allocator<IntegratorXX::PruningRegion>_>::
           operator[](pruning_regions,0);
  AVar1 = pvVar5->angular_quad;
  __end2 = std::vector<IntegratorXX::PruningRegion,_std::allocator<IntegratorXX::PruningRegion>_>::
           begin(pruning_regions);
  r.angular_size =
       (AngularSize)
       std::vector<IntegratorXX::PruningRegion,_std::allocator<IntegratorXX::PruningRegion>_>::end
                 (pruning_regions);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_IntegratorXX::PruningRegion_*,_std::vector<IntegratorXX::PruningRegion,_std::allocator<IntegratorXX::PruningRegion>_>_>
                                *)&r.angular_size);
    if (!bVar2) break;
    pPVar6 = __gnu_cxx::
             __normal_iterator<const_IntegratorXX::PruningRegion_*,_std::vector<IntegratorXX::PruningRegion,_std::allocator<IntegratorXX::PruningRegion>_>_>
             ::operator*(&__end2);
    r.idx_st = pPVar6->idx_en;
    r.idx_en = *(size_t *)&pPVar6->angular_quad;
    r._16_8_ = pPVar6->angular_size;
    if ((AngularQuad)r.idx_en != AVar1) {
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar4,"Mixed Angular Pruning Not Supported");
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    __gnu_cxx::
    __normal_iterator<const_IntegratorXX::PruningRegion_*,_std::vector<IntegratorXX::PruningRegion,_std::allocator<IntegratorXX::PruningRegion>_>_>
    ::operator++(&__end2);
  }
  if (AVar1 == AhrensBeylkin) {
    sVar8 = make_pruned_grid_impl<IntegratorXX::AhrensBeylkin<double>,IntegratorXX::RadialTransformQuadrature<IntegratorXX::GaussChebyshev2<double,double>,IntegratorXX::TreutlerAhlrichsRadialTraits>>
                      (this,rq,pruning_regions);
    _Var7 = sVar8.
            super___shared_ptr<IntegratorXX::SphericalQuadratureBase<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi;
  }
  else if (AVar1 == Delley) {
    sVar8 = make_pruned_grid_impl<IntegratorXX::Delley<double>,IntegratorXX::RadialTransformQuadrature<IntegratorXX::GaussChebyshev2<double,double>,IntegratorXX::TreutlerAhlrichsRadialTraits>>
                      (this,rq,pruning_regions);
    _Var7 = sVar8.
            super___shared_ptr<IntegratorXX::SphericalQuadratureBase<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi;
  }
  else if (AVar1 == LebedevLaikov) {
    sVar8 = make_pruned_grid_impl<IntegratorXX::LebedevLaikov<double>,IntegratorXX::RadialTransformQuadrature<IntegratorXX::GaussChebyshev2<double,double>,IntegratorXX::TreutlerAhlrichsRadialTraits>>
                      (this,rq,pruning_regions);
    _Var7 = sVar8.
            super___shared_ptr<IntegratorXX::SphericalQuadratureBase<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi;
  }
  else {
    if (AVar1 != Womersley) {
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar4,"Unsupported Angular Quadrature");
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    sVar8 = make_pruned_grid_impl<IntegratorXX::Womersley<double>,IntegratorXX::RadialTransformQuadrature<IntegratorXX::GaussChebyshev2<double,double>,IntegratorXX::TreutlerAhlrichsRadialTraits>>
                      (this,rq,pruning_regions);
    _Var7 = sVar8.
            super___shared_ptr<IntegratorXX::SphericalQuadratureBase<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi;
  }
  sVar8.
  super___shared_ptr<IntegratorXX::SphericalQuadratureBase<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = _Var7._M_pi;
  sVar8.
  super___shared_ptr<IntegratorXX::SphericalQuadratureBase<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this;
  return (spherical_grid_ptr)
         sVar8.
         super___shared_ptr<IntegratorXX::SphericalQuadratureBase<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

auto make_pruned_grid(const RadialQuadType& rq, 
  const std::vector<PruningRegion>& pruning_regions) {

  if(pruning_regions.size() == 0)
    throw std::runtime_error("No Pruning Regions");

  auto angular_quad = pruning_regions[0].angular_quad;
  for(auto r : pruning_regions) {
    if(r.angular_quad != angular_quad)
      throw std::runtime_error("Mixed Angular Pruning Not Supported");
  }

  switch(angular_quad) {
    case AngularQuad::AhrensBeylkin:
      return make_pruned_grid_impl<ah_type>(rq, pruning_regions);
    case AngularQuad::Delley:
      return make_pruned_grid_impl<de_type>(rq, pruning_regions);
    case AngularQuad::LebedevLaikov:
      return make_pruned_grid_impl<ll_type>(rq, pruning_regions);
    case AngularQuad::Womersley:
      return make_pruned_grid_impl<wo_type>(rq, pruning_regions);
    default:
      throw std::runtime_error("Unsupported Angular Quadrature");
      abort();
  }
  

}